

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

WhileStatement * __thiscall SQCompilation::SQParser::parseWhileStatement(SQParser *this)

{
  long lVar1;
  SQInteger SVar2;
  bool bVar3;
  Expr *args;
  Statement *args_1;
  WhileStatement *pWVar4;
  bool local_39;
  NestingChecker nc;
  
  NestingChecker::NestingChecker(&nc,this);
  lVar1 = (this->_lex)._tokencolumn;
  SVar2 = (this->_lex)._tokenline;
  Lex(this);
  Expect(this,0x28);
  args = Expression(this,SQE_LOOP_CONDITION);
  Expect(this,0x29);
  checkBraceIndentationStyle(this);
  args_1 = IfLikeBlock(this,&local_39);
  bVar3 = IsEndOfStatement(this);
  if (!bVar3) {
    reportDiagnostic(this,0x38,"while loop body");
  }
  if ((((this->_token != 0) && (this->_token != 0x7d)) &&
      ((this->_lex)._tokenline != (long)(args_1->super_Node)._coordinates.lineEnd)) &&
     (lVar1 < (this->_lex)._tokencolumn)) {
    reportDiagnostic(this,0x68);
  }
  pWVar4 = newNode<SQCompilation::WhileStatement,SQCompilation::Expr*,SQCompilation::Statement*>
                     (this,args,args_1);
  (pWVar4->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart = (int)SVar2;
  (pWVar4->super_LoopStatement).super_Statement.super_Node._coordinates.columnStart = (int)lVar1;
  (pWVar4->super_LoopStatement).super_Statement.super_Node._coordinates.lineEnd =
       (int)(this->_lex)._currentline;
  (pWVar4->super_LoopStatement).super_Statement.super_Node._coordinates.columnEnd =
       (int)(this->_lex)._currentcolumn;
  (nc._p)->_depth = (nc._p)->_depth - nc._depth;
  return pWVar4;
}

Assistant:

WhileStatement* SQParser::parseWhileStatement()
{
    NestingChecker nc(this);

    SQInteger l = line(), c = column();

    Consume(TK_WHILE);

    Expect(_SC('('));
    Expr *cond = Expression(SQE_LOOP_CONDITION);
    Expect(_SC(')'));

    bool wrapped = false;
    checkBraceIndentationStyle();
    Statement *body = IfLikeBlock(wrapped);

    if (!IsEndOfStatement()) {
      reportDiagnostic(DiagnosticsId::DI_STMT_SAME_LINE, "while loop body");
    }

    if (_token != SQUIRREL_EOB && _token != _SC('}')) {
      if (line() != body->lineEnd() && column() > c) {
        reportDiagnostic(DiagnosticsId::DI_SUSPICIOUS_FMT);
      }
    }

    return setCoordinates(newNode<WhileStatement>(cond, body), l, c);
}